

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O0

void __thiscall OpenMD::Molecule::addBond(Molecule *this,Bond *bond)

{
  bool bVar1;
  iterator __last;
  iterator __val;
  iterator __lhs;
  vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_> *in_RDI;
  __normal_iterator<OpenMD::Bond_**,_std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>_>
  in_stack_ffffffffffffffe8;
  
  __last = std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::begin(in_RDI);
  __val = std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::end(in_RDI);
  std::
  find<__gnu_cxx::__normal_iterator<OpenMD::Bond**,std::vector<OpenMD::Bond*,std::allocator<OpenMD::Bond*>>>,OpenMD::Bond*>
            (in_stack_ffffffffffffffe8,
             (__normal_iterator<OpenMD::Bond_**,_std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>_>
              )__last._M_current,__val._M_current);
  __lhs = std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::end(in_RDI);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<OpenMD::Bond_**,_std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>_>
                      *)__lhs._M_current,
                     (__normal_iterator<OpenMD::Bond_**,_std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>_>
                      *)in_RDI);
  if (bVar1) {
    std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::push_back
              ((vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_> *)__last._M_current,
               __val._M_current);
  }
  return;
}

Assistant:

void Molecule::addBond(Bond* bond) {
    if (std::find(bonds_.begin(), bonds_.end(), bond) == bonds_.end()) {
      bonds_.push_back(bond);
    }
  }